

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall
leveldb::_Test_L0_CompactionBug_Issue44_b::_Run(_Test_L0_CompactionBug_Issue44_b *this)

{
  undefined1 local_698 [448];
  undefined1 local_4d8 [455];
  allocator local_311;
  string local_310 [32];
  undefined1 local_2f0 [16];
  string local_2e0 [32];
  undefined1 local_2c0 [16];
  string local_2b0 [39];
  allocator local_289;
  string local_288 [32];
  undefined1 local_268 [16];
  string local_258 [39];
  allocator local_231;
  string local_230 [32];
  undefined1 local_210 [16];
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [32];
  undefined1 local_1b8 [16];
  string local_1a8 [39];
  allocator local_181;
  string local_180 [32];
  undefined1 local_160 [16];
  string local_150 [39];
  allocator local_129;
  string local_128 [32];
  undefined1 local_108 [16];
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [32];
  undefined1 local_b0 [16];
  string local_a0 [32];
  undefined1 local_80 [16];
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  undefined1 local_18 [16];
  _Test_L0_CompactionBug_Issue44_b *this_local;
  
  local_18._8_8_ = this;
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",(allocator *)(local_80 + 0xf));
  DBTest::Put((DBTest *)local_18,(string *)this,(string *)local_38);
  Status::~Status((Status *)local_18);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)(local_80 + 0xf));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"e",(allocator *)(local_b0 + 0xf));
  DBTest::Delete((DBTest *)local_80,(string *)this);
  Status::~Status((Status *)local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)(local_b0 + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"",&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"",(allocator *)(local_108 + 0xf));
  DBTest::Put((DBTest *)local_b0,(string *)this,(string *)local_d0);
  Status::~Status((Status *)local_b0);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)(local_108 + 0xf));
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"c",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"cv",(allocator *)(local_160 + 0xf));
  DBTest::Put((DBTest *)local_108,(string *)this,(string *)local_128);
  Status::~Status((Status *)local_108);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)(local_160 + 0xf));
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"",&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"",(allocator *)(local_1b8 + 0xf));
  DBTest::Put((DBTest *)local_160,(string *)this,(string *)local_180);
  Status::~Status((Status *)local_160);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)(local_1b8 + 0xf));
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"",&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"",(allocator *)(local_210 + 0xf));
  DBTest::Put((DBTest *)local_1b8,(string *)this,(string *)local_1d8);
  Status::~Status((Status *)local_1b8);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)(local_210 + 0xf));
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  anon_unknown_4::DelayMilliseconds(1000);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"d",&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"dv",(allocator *)(local_268 + 0xf));
  DBTest::Put((DBTest *)local_210,(string *)this,(string *)local_230);
  Status::~Status((Status *)local_210);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)(local_268 + 0xf));
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"",&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"",(allocator *)(local_2c0 + 0xf));
  DBTest::Put((DBTest *)local_268,(string *)this,(string *)local_288);
  Status::~Status((Status *)local_268);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)(local_2c0 + 0xf));
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"d",(allocator *)(local_2f0 + 0xf));
  DBTest::Delete((DBTest *)local_2c0,(string *)this);
  Status::~Status((Status *)local_2c0);
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)(local_2f0 + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_310,"b",&local_311);
  DBTest::Delete((DBTest *)local_2f0,(string *)this);
  Status::~Status((Status *)local_2f0);
  std::__cxx11::string::~string(local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  DBTest::Reopen(&this->super_DBTest,(Options *)0x0);
  test::Tester::Tester
            ((Tester *)(local_4d8 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x5d2);
  DBTest::Contents_abi_cxx11_((DBTest *)local_4d8);
  test::Tester::IsEq<char[12],std::__cxx11::string>
            ((Tester *)(local_4d8 + 0x20),(char (*) [12])"(->)(c->cv)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8);
  std::__cxx11::string::~string((string *)local_4d8);
  test::Tester::~Tester((Tester *)(local_4d8 + 0x20));
  anon_unknown_4::DelayMilliseconds(1000);
  test::Tester::Tester
            ((Tester *)(local_698 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x5d4);
  DBTest::Contents_abi_cxx11_((DBTest *)local_698);
  test::Tester::IsEq<char[12],std::__cxx11::string>
            ((Tester *)(local_698 + 0x20),(char (*) [12])"(->)(c->cv)",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_698);
  std::__cxx11::string::~string((string *)local_698);
  test::Tester::~Tester((Tester *)(local_698 + 0x20));
  return;
}

Assistant:

TEST(DBTest, L0_CompactionBug_Issue44_b) {
  Reopen();
  Put("", "");
  Reopen();
  Delete("e");
  Put("", "");
  Reopen();
  Put("c", "cv");
  Reopen();
  Put("", "");
  Reopen();
  Put("", "");
  DelayMilliseconds(1000);  // Wait for compaction to finish
  Reopen();
  Put("d", "dv");
  Reopen();
  Put("", "");
  Reopen();
  Delete("d");
  Delete("b");
  Reopen();
  ASSERT_EQ("(->)(c->cv)", Contents());
  DelayMilliseconds(1000);  // Wait for compaction to finish
  ASSERT_EQ("(->)(c->cv)", Contents());
}